

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O2

void Abc_NtkManRefPrintStats(Abc_ManRef_t *p)

{
  int level;
  
  puts("Refactoring statistics:");
  printf("Nodes considered  = %8d.\n",(ulong)(uint)p->nNodesConsidered);
  printf("Nodes refactored  = %8d.\n",(ulong)(uint)p->nNodesRefactored);
  level = 0x6b4b84;
  printf("Gain              = %8d. (%6.2f %%).\n",
         ((double)(p->nNodesBeg - p->nNodesEnd) * 100.0) / (double)p->nNodesBeg);
  Abc_Print(level,"%s =","Cuts       ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeCut / 1000000.0);
  Abc_Print(level,"%s =","Resynthesis");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeRes / 1000000.0);
  Abc_Print(level,"%s =","    BDD    ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeTru / 1000000.0);
  Abc_Print(level,"%s =","    DCs    ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeDcs / 1000000.0);
  Abc_Print(level,"%s =","    SOP    ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeSop / 1000000.0);
  Abc_Print(level,"%s =","    FF     ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeFact / 1000000.0);
  Abc_Print(level,"%s =","    Eval   ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeEval / 1000000.0);
  Abc_Print(level,"%s =","AIG update ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeNtk / 1000000.0);
  Abc_Print(level,"%s =","TOTAL      ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeTotal / 1000000.0);
  return;
}

Assistant:

void Abc_NtkManRefPrintStats( Abc_ManRef_t * p )
{
    printf( "Refactoring statistics:\n" );
    printf( "Nodes considered  = %8d.\n", p->nNodesConsidered );
    printf( "Nodes refactored  = %8d.\n", p->nNodesRefactored );
    printf( "Gain              = %8d. (%6.2f %%).\n", p->nNodesBeg-p->nNodesEnd, 100.0*(p->nNodesBeg-p->nNodesEnd)/p->nNodesBeg );
    ABC_PRT( "Cuts       ", p->timeCut );
    ABC_PRT( "Resynthesis", p->timeRes );
    ABC_PRT( "    BDD    ", p->timeTru );
    ABC_PRT( "    DCs    ", p->timeDcs );
    ABC_PRT( "    SOP    ", p->timeSop );
    ABC_PRT( "    FF     ", p->timeFact );
    ABC_PRT( "    Eval   ", p->timeEval );
    ABC_PRT( "AIG update ", p->timeNtk );
    ABC_PRT( "TOTAL      ", p->timeTotal );
}